

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplePreprocessor.hpp
# Opt level: O0

bool __thiscall
OpenMD::SimplePreprocessor::preprocess
          (SimplePreprocessor *this,istream *myStream,string *filename,int startingLine,ostream *os)

{
  bool bVar1;
  stack<bool,_std::deque<bool,_std::allocator<bool>_>_> ifStates;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defineSet;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000025a0;
  ostream *in_stack_000025a8;
  int in_stack_000025b4;
  string *in_stack_000025b8;
  istream *in_stack_000025c0;
  SimplePreprocessor *in_stack_000025c8;
  stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *in_stack_000025e0;
  value_type *in_stack_ffffffffffffff28;
  stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *in_stack_ffffffffffffff30;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x14d398);
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>(in_stack_ffffffffffffff30);
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  bVar1 = doPreprocess(in_stack_000025c8,in_stack_000025c0,in_stack_000025b8,in_stack_000025b4,
                       in_stack_000025a8,in_stack_000025a0,in_stack_000025e0);
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::~stack
            ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)0x14d406);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x14d413);
  return bVar1;
}

Assistant:

bool preprocess(std::istream& myStream, const std::string& filename, int startingLine, ostream& os) {
            std::set<std::string> defineSet;
            std::stack<bool> ifStates;

            ifStates.push(true);
            return doPreprocess(myStream, filename, startingLine, os, defineSet, ifStates);
        }